

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest7_8::logError
          (FunctionalTest7_8 *this,GLuint *combination,vec4<float> *left,vec4<float> *right,
          vec4<unsigned_int> *indices,vec4<float> *vec4_expected,vec4<float> *vec4_result,
          GLuint array_length,bool *result)

{
  undefined1 *__return_storage_ptr__;
  TestContext *pTVar1;
  TestLog *pTVar2;
  MessageBuilder *pMVar3;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  vec4<float> *local_a58;
  GLchar local_a4b;
  GLchar local_a49;
  MessageBuilder local_a40;
  MessageBuilder local_8c0;
  MessageBuilder local_740;
  uint local_5bc;
  undefined1 local_5b8 [4];
  GLuint function_1;
  MessageBuilder message;
  MessageBuilder local_2a8;
  GLuint *local_128;
  GLchar *operation;
  vec4<float> *input;
  GLchar *description;
  undefined1 auStack_108 [4];
  GLuint i_1;
  vec4<float> dynamic_values [5];
  vec4<float> constant_values [5];
  uint local_5c;
  GLchar dynamic_function;
  GLchar function;
  GLuint i;
  GLchar functions_dynamic_inverted [4];
  GLchar functions_dynamic [4];
  GLchar functions_inverted [4];
  GLchar functions [4];
  GLuint dynamic_combination [4];
  vec4<float> *vec4_expected_local;
  vec4<unsigned_int> *indices_local;
  vec4<float> *right_local;
  vec4<float> *left_local;
  GLuint *combination_local;
  FunctionalTest7_8 *this_local;
  
  functions_inverted = *(GLchar (*) [4])(combination + indices->m_x);
  for (local_5c = 0; local_5c < 4; local_5c = local_5c + 1) {
    local_a49 = '+';
    if (combination[local_5c] != 0) {
      local_a49 = '*';
    }
    local_a4b = '+';
    if (*(int *)(functions_inverted + (ulong)local_5c * 4) != 0) {
      local_a4b = '*';
    }
    functions_dynamic[local_5c] = local_a49;
    functions_dynamic_inverted[3 - local_5c] = local_a49;
    functions_dynamic_inverted[(ulong)local_5c - 4] = local_a4b;
    (&stack0xffffffffffffffa8)[3 - local_5c] = local_a4b;
  }
  Utils::vec4<float>::vec4((vec4<float> *)&dynamic_values[4].m_z,1.0,2.0,3.0,4.0);
  Utils::vec4<float>::vec4((vec4<float> *)&constant_values[0].m_z,-5.0,-6.0,-7.0,-8.0);
  Utils::vec4<float>::vec4((vec4<float> *)&constant_values[1].m_z,-1.0,-2.0,-3.0,-4.0);
  Utils::vec4<float>::vec4((vec4<float> *)&constant_values[2].m_z,5.0,6.0,7.0,8.0);
  Utils::vec4<float>::vec4((vec4<float> *)&constant_values[3].m_z,1.0,2.0,3.0,4.0);
  local_a58 = (vec4<float> *)auStack_108;
  do {
    Utils::vec4<float>::vec4(local_a58);
    local_a58 = local_a58 + 1;
  } while (local_a58 != (vec4<float> *)&dynamic_values[4].m_z);
  auStack_108 = left->m_x;
  unique0x00012004 = left->m_y;
  dynamic_values[0].m_x = left->m_z;
  dynamic_values[0].m_y = left->m_w;
  dynamic_values[0].m_z = right->m_x;
  dynamic_values[0].m_w = right->m_y;
  dynamic_values[1].m_x = right->m_z;
  dynamic_values[1].m_y = right->m_w;
  dynamic_values[1].m_z = right->m_x;
  dynamic_values[1].m_w = right->m_y;
  dynamic_values[2].m_x = right->m_z;
  dynamic_values[2].m_y = right->m_w;
  dynamic_values[2].m_z = right->m_x;
  dynamic_values[2].m_w = right->m_y;
  dynamic_values[3].m_x = right->m_z;
  dynamic_values[3].m_y = right->m_w;
  dynamic_values[3].m_z = right->m_x;
  dynamic_values[3].m_w = right->m_y;
  dynamic_values[4].m_x = right->m_z;
  dynamic_values[4].m_y = right->m_w;
  for (description._4_4_ = 0; description._4_4_ < 7; description._4_4_ = description._4_4_ + 1) {
    if ((result[description._4_4_] & 1U) == 0) {
      input = (vec4<float> *)0x0;
      operation = (GLchar *)0x0;
      local_128 = (GLuint *)0x0;
      switch(description._4_4_) {
      case 0:
        input = (vec4<float> *)anon_var_dwarf_242c2e;
        operation = auStack_108;
        local_128 = (GLuint *)functions_dynamic;
        break;
      case 1:
        input = (vec4<float> *)anon_var_dwarf_242c3b;
        operation = auStack_108;
        local_128 = (GLuint *)functions_dynamic_inverted;
        break;
      case 2:
        input = (vec4<float> *)anon_var_dwarf_242c54;
        operation = (GLchar *)&dynamic_values[4].m_z;
        local_128 = (GLuint *)functions_dynamic;
        break;
      case 3:
        input = (vec4<float> *)anon_var_dwarf_242c61;
        operation = (GLchar *)&dynamic_values[4].m_z;
        local_128 = (GLuint *)functions_dynamic_inverted;
        break;
      case 4:
        input = (vec4<float> *)anon_var_dwarf_242c6e;
        operation = auStack_108;
        local_128 = &i;
        break;
      case 5:
        input = (vec4<float> *)anon_var_dwarf_242c87;
        operation = auStack_108;
        local_128 = (GLuint *)&stack0xffffffffffffffa8;
        break;
      case 6:
        input = (vec4<float> *)anon_var_dwarf_242ca0;
        operation = auStack_108;
        local_128 = (GLuint *)functions_dynamic;
      }
      pTVar1 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar2 = tcu::TestContext::getLog(pTVar1);
      tcu::TestLog::operator<<(&local_2a8,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar3 = tcu::MessageBuilder::operator<<(&local_2a8,(char (*) [23])"Error. Invalid result.");
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_2a8);
      pTVar1 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar2 = tcu::TestContext::getLog(pTVar1);
      __return_storage_ptr__ = &message.m_str.field_0x170;
      tcu::TestLog::operator<<
                ((MessageBuilder *)__return_storage_ptr__,pTVar2,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar3 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)__return_storage_ptr__,(char **)&input);
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&message.m_str.field_0x170);
      pTVar1 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar2 = tcu::TestContext::getLog(pTVar1);
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_5b8,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
      tcu::MessageBuilder::operator<<((MessageBuilder *)local_5b8,(char (*) [16])"Operation: ((((");
      Utils::vec4<float>::log((vec4<float> *)operation,__x);
      for (local_5bc = 0; local_5bc < 4; local_5bc = local_5bc + 1) {
        pMVar3 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_5b8,(char (*) [2])0x2c7b4d6);
        pMVar3 = tcu::MessageBuilder::operator<<
                           (pMVar3,(char *)((long)local_128 + (ulong)local_5bc));
        tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2c7b4d6);
        Utils::vec4<float>::log((vec4<float> *)(operation + (ulong)(local_5bc + 1) * 0x10),__x_00);
        tcu::MessageBuilder::operator<<((MessageBuilder *)local_5b8,(char (*) [2])0x2a94734);
      }
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_5b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      pTVar1 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar2 = tcu::TestContext::getLog(pTVar1);
      tcu::TestLog::operator<<(&local_740,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
      tcu::MessageBuilder::operator=((MessageBuilder *)local_5b8,&local_740);
      tcu::MessageBuilder::~MessageBuilder(&local_740);
      tcu::MessageBuilder::operator<<((MessageBuilder *)local_5b8,(char (*) [9])0x2a1a406);
      Utils::vec4<float>::log(vec4_result + description._4_4_,__x_01);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_5b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      pTVar1 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar2 = tcu::TestContext::getLog(pTVar1);
      tcu::TestLog::operator<<(&local_8c0,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
      tcu::MessageBuilder::operator=((MessageBuilder *)local_5b8,&local_8c0);
      tcu::MessageBuilder::~MessageBuilder(&local_8c0);
      tcu::MessageBuilder::operator<<((MessageBuilder *)local_5b8,(char (*) [11])0x2b01f60);
      Utils::vec4<float>::log(vec4_expected + description._4_4_,__x_02);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_5b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_5b8);
    }
    if (array_length != 4) {
      pTVar1 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar2 = tcu::TestContext::getLog(pTVar1);
      tcu::TestLog::operator<<(&local_a40,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar3 = tcu::MessageBuilder::operator<<
                         (&local_a40,(char (*) [30])"Error. Invalid array length: ");
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&array_length);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [14])". Expected 4.");
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_a40);
    }
  }
  return;
}

Assistant:

void FunctionalTest7_8::logError(const glw::GLuint combination[4], const Utils::vec4<glw::GLfloat>& left,
								 const Utils::vec4<glw::GLfloat>& right, const Utils::vec4<glw::GLuint>& indices,
								 const Utils::vec4<glw::GLfloat> vec4_expected[7],
								 const Utils::vec4<glw::GLfloat> vec4_result[7], glw::GLuint array_length,
								 bool result[7]) const
{
	static const GLuint n_functions  = 4;
	static const GLuint n_operations = 7;

	/* Indices used by "dynamic" operations, range <0..4> */
	const GLuint dynamic_combination[4] = { combination[indices.m_x], combination[indices.m_y],
											combination[indices.m_z], combination[indices.m_w] };

	/* Function symbols */
	GLchar functions[4];
	GLchar functions_inverted[4];
	GLchar functions_dynamic[4];
	GLchar functions_dynamic_inverted[4];

	for (GLuint i = 0; i < n_functions; ++i)
	{
		GLchar function			= (0 == combination[i]) ? '+' : '*';
		GLchar dynamic_function = (0 == dynamic_combination[i]) ? '+' : '*';

		functions[i]									= function;
		functions_inverted[n_functions - i - 1]			= function;
		functions_dynamic[i]							= dynamic_function;
		functions_dynamic_inverted[n_functions - i - 1] = dynamic_function;
	}

	/* Values used by "constant" operations, come from shader code */
	const Utils::vec4<glw::GLfloat> constant_values[] = { Utils::vec4<glw::GLfloat>(1, 2, 3, 4),
														  Utils::vec4<glw::GLfloat>(-5, -6, -7, -8),
														  Utils::vec4<glw::GLfloat>(-1, -2, -3, -4),
														  Utils::vec4<glw::GLfloat>(5, 6, 7, 8),
														  Utils::vec4<glw::GLfloat>(1, 2, 3, 4) };

	/* Values used by non-"constant" operations */
	Utils::vec4<glw::GLfloat> dynamic_values[5];
	dynamic_values[0] = left;
	dynamic_values[1] = right;
	dynamic_values[2] = right;
	dynamic_values[3] = right;
	dynamic_values[4] = right;

	/* For each operation */
	for (GLuint i = 0; i < n_operations; ++i)
	{
		/* If result is failure */
		if (false == result[i])
		{
			const GLchar*					 description = 0;
			const Utils::vec4<glw::GLfloat>* input		 = 0;
			const GLchar*					 operation   = 0;

			switch (i)
			{
			case 0:
				description = "Call made with predefined array indices";
				input		= dynamic_values;
				operation   = functions;
				break;
			case 1:
				description = "Call made with predefined array indices in inverted order";
				input		= dynamic_values;
				operation   = functions_inverted;
				break;
			case 2:
				description = "Call made with predefined array indices, for constant values";
				input		= constant_values;
				operation   = functions;
				break;
			case 3:
				description = "Call made with predefined array indices in inverted order, for constant values";
				input		= constant_values;
				operation   = functions_inverted;
				break;
			case 4:
				description = "Call made with dynamic array indices";
				input		= dynamic_values;
				operation   = functions_dynamic;
				break;
			case 5:
				description = "Call made with dynamic array indices in inverted order";
				input		= dynamic_values;
				operation   = functions_dynamic_inverted;
				break;
			case 6:
				description = "Call made with loop";
				input		= dynamic_values;
				operation   = functions;
				break;
			}

			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Error. Invalid result."
												<< tcu::TestLog::EndMessage;

			m_context.getTestContext().getLog() << tcu::TestLog::Message << description << tcu::TestLog::EndMessage;

			tcu::MessageBuilder message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

			message << "Operation: ((((";
			input[0].log(message);
			for (GLuint function = 0; function < n_functions; ++function)
			{
				message << " " << operation[function] << " ";

				input[function + 1].log(message);

				message << ")";
			}

			message << tcu::TestLog::EndMessage;

			message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

			message << "Result: ";
			vec4_result[i].log(message);

			message << tcu::TestLog::EndMessage;

			message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

			message << "Expected: ";
			vec4_expected[i].log(message);

			message << tcu::TestLog::EndMessage;
		}

		/* Check array length, it should be 4 */
		if (4 != array_length)
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "Error. Invalid array length: " << array_length << ". Expected 4."
												<< tcu::TestLog::EndMessage;
		}
	}
}